

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O3

BOOL __thiscall
Js::CustomExternalWrapperObject::DeleteProperty
          (CustomExternalWrapperObject *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this_00;
  DynamicObject *aValue;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  Attributes attributes;
  HostScriptContext *pHVar5;
  JavascriptFunction *function;
  Type *pTVar6;
  undefined4 *puVar7;
  JavascriptMethod p_Var8;
  RecyclableObject *ptr;
  char *this_01;
  ScriptContext *pSVar9;
  PropertyId propertyId_00;
  undefined1 local_a0 [8];
  PropertyDescriptor targetPropertyDescriptor;
  Var isPropertyNameNumeric;
  Var propertyNameNumericValue;
  ScriptContext *local_58;
  Var local_50;
  Type local_48;
  Type TStack_47;
  undefined6 uStack_46;
  JavascriptFunction *local_40;
  PropertyId local_34;
  
  BVar4 = VerifyObjectAlive(this);
  if (BVar4 == 0) {
    return 0;
  }
  pSVar9 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar9->threadContext,0xc00,pSVar9,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  pHVar5 = ThreadContext::GetPreviousHostScriptContext(this_00);
  local_58 = pHVar5->scriptContext;
  BVar4 = EnsureInitialized(this,local_58);
  if (BVar4 == 0) {
    return 0;
  }
  pTVar6 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  aValue = (pTVar6[1].propertyCache.ptr)->elements[1].prototypeObjectWithProperty.ptr;
  if (aValue == (DynamicObject *)0x0) {
    function = (JavascriptFunction *)0x0;
  }
  else {
    function = VarTo<Js::JavascriptFunction>(aValue);
    pTVar6 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  }
  this_01 = (char *)((((pTVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                    ptr)->recycler;
  bVar3 = Memory::Recycler::IsHeapEnumInProgress((Recycler *)this_01);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    local_40 = function;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
    ;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0x435,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                "!GetScriptContext()->IsHeapEnumInProgress()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
    function = local_40;
  }
  if (function == (JavascriptFunction *)0x0) {
    BVar4 = DynamicObject::DeleteProperty(&this->super_DynamicObject,propertyId,flags);
    return BVar4;
  }
  propertyNameNumericValue._4_4_ = flags;
  local_34 = propertyId;
  local_50 = GetName((CustomExternalWrapperObject *)this_01,local_58,propertyId,
                     (Var *)&targetPropertyDescriptor.Configurable,&isPropertyNameNumeric);
  local_48 = targetPropertyDescriptor.Configurable;
  TStack_47 = targetPropertyDescriptor.fromProxy;
  uStack_46 = targetPropertyDescriptor._42_6_;
  local_40 = (JavascriptFunction *)CONCAT71(local_40._1_7_,this_00->reentrancySafeOrHandled);
  this_00->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar3 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar3) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    propertyId_00 = local_34;
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var8);
    p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var8)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,0x2000004,this
                    ,local_50,_local_48,isPropertyNameNumeric);
    bVar3 = ThreadContext::IsOnStack(ptr);
LAB_00b35704:
    if (bVar3 != false) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
      propertyId_00 = local_34;
      if (this_00->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      CheckIsExecutable((RecyclableObject *)function,p_Var8);
      p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      ptr = (RecyclableObject *)
            (*p_Var8)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,0x2000004,
                      this,local_50,_local_48,isPropertyNameNumeric);
      bVar3 = ThreadContext::IsOnStack(ptr);
      goto LAB_00b35704;
    }
    IVar1 = this_00->implicitCallFlags;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var8);
    p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var8)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,0x2000004,this
                    ,local_50,_local_48,isPropertyNameNumeric);
    this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
    propertyId_00 = local_34;
  }
  else {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue
          .ptr;
    propertyId_00 = local_34;
  }
  pSVar9 = local_58;
  this_00->reentrancySafeOrHandled = local_40._0_1_;
  BVar4 = JavascriptConversion::ToBoolean(ptr,local_58);
  if (BVar4 == 0) {
    BVar4 = 0;
    pSVar9 = local_58;
    if ((propertyNameNumericValue._4_4_ & PropertyOperation_StrictMode) != PropertyOperation_None)
    goto LAB_00b358f2;
  }
  else {
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_a0);
    BVar4 = JavascriptOperators::GetOwnPropertyDescriptor
                      ((RecyclableObject *)this,propertyId_00,pSVar9,(PropertyDescriptor *)local_a0)
    ;
    if ((BVar4 != 0) &&
       (bVar3 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_a0), !bVar3)) {
LAB_00b358f2:
      JavascriptError::ThrowTypeError(pSVar9,-0x7ff5ea14,L"deleteProperty");
    }
    BVar4 = 1;
  }
  return BVar4;
}

Assistant:

BOOL CustomExternalWrapperObject::DeleteProperty(Js::PropertyId propertyId, Js::PropertyOperationFlags flags)
{
    if (!this->VerifyObjectAlive()) return FALSE;

    PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

    ThreadContext* threadContext = GetScriptContext()->GetThreadContext();

    // Caller does not pass requestContext. Retrieve from host scriptContext stack.
    Js::ScriptContext* requestContext =
        threadContext->GetPreviousHostScriptContext()->GetScriptContext();

    if (!this->EnsureInitialized(requestContext))
    {
        return FALSE;
    }

    RecyclableObject * targetObj = this;
    CustomExternalWrapperType * type = this->GetExternalType();
    Js::JavascriptFunction* deleteMethod = nullptr;
    if (type->GetJsGetterSetterInterceptor()->deletePropertyTrap != nullptr)
    {
        deleteMethod = Js::VarTo<JavascriptFunction>(type->GetJsGetterSetterInterceptor()->deletePropertyTrap);
    }

    Assert(!GetScriptContext()->IsHeapEnumInProgress());
    if (nullptr == deleteMethod)
    {
        return __super::DeleteProperty(propertyId, flags);
    }

    Js::Var isPropertyNameNumeric;
    Js::Var propertyNameNumericValue;
    Js::Var propertyName = GetName(requestContext, propertyId, &isPropertyNameNumeric, &propertyNameNumericValue);

    Js::Var deletePropertyResult = threadContext->ExecuteImplicitCall(deleteMethod, Js::ImplicitCall_Accessor, [=]()->Js::Var
    {
        return CALL_FUNCTION(threadContext, deleteMethod, Js::CallInfo(Js::CallFlags_Value, 4), targetObj, propertyName, isPropertyNameNumeric, propertyNameNumericValue);
    });

    BOOL trapResult = Js::JavascriptConversion::ToBoolean(deletePropertyResult, requestContext);
    if (!trapResult)
    {
        if (flags & Js::PropertyOperation_StrictMode)
        {
            Js::JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("deleteProperty"));
        }
        return trapResult;
    }

    Js::PropertyDescriptor targetPropertyDescriptor;
    if (!Js::JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, &targetPropertyDescriptor))
    {
        return TRUE;
    }
    if (!targetPropertyDescriptor.IsConfigurable())
    {
        Js::JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("deleteProperty"));
    }
    return TRUE;
}